

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall Catch::Matchers::Impl::StdString::Equals::~Equals(Equals *this)

{
  Equals *this_local;
  
  (this->
  super_MatcherImpl<Catch::Matchers::Impl::StdString::Equals,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ).super_Matcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>.
  super_SharedImpl<Catch::IShared>.super_IShared.super_NonCopyable._vptr_NonCopyable =
       (_func_int **)&PTR__Equals_001ee0c0;
  CasedString::~CasedString(&this->m_data);
  MatcherImpl<Catch::Matchers::Impl::StdString::Equals,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~MatcherImpl(&this->
                  super_MatcherImpl<Catch::Matchers::Impl::StdString::Equals,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                );
  return;
}

Assistant:

Matchers::Impl::StdString::Equals::~Equals() {}